

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_2_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  float *data;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  float *pfVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  int iVar37;
  float *pfVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  int k_count;
  long lVar44;
  int iVar45;
  float *pfVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  int data_width;
  
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  fVar61 = ipoint->scale;
  auVar79 = ZEXT464((uint)fVar61);
  auVar47 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)fVar61),auVar54,0xf8);
  auVar47 = ZEXT416((uint)(fVar61 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  iVar42 = (int)auVar47._0_4_;
  fVar60 = -0.08 / (fVar61 * fVar61);
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->x),auVar54,0xf8);
  auVar48 = ZEXT416((uint)(ipoint->x + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49._0_8_ = (double)auVar48._0_4_;
  auVar49._8_8_ = auVar48._8_8_;
  auVar53._0_8_ = (double)fVar61;
  auVar53._8_8_ = 0;
  auVar48 = vfmadd231sd_fma(auVar49,auVar53,ZEXT816(0x3fe0000000000000));
  auVar52._0_4_ = (float)auVar48._0_8_;
  auVar52._4_12_ = auVar48._4_12_;
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->y),auVar54,0xf8);
  auVar48 = ZEXT416((uint)(ipoint->y + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar50._0_8_ = (double)auVar48._0_4_;
  auVar50._8_8_ = auVar48._8_8_;
  auVar48 = vfmadd231sd_fma(auVar50,auVar53,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar48._0_8_;
  auVar51._4_12_ = auVar48._4_12_;
  auVar48._0_4_ = (int)auVar47._0_4_;
  auVar48._4_4_ = (int)auVar47._4_4_;
  auVar48._8_4_ = (int)auVar47._8_4_;
  auVar48._12_4_ = (int)auVar47._12_4_;
  auVar47 = vcvtdq2ps_avx(auVar48);
  fVar3 = auVar52._0_4_ - auVar47._0_4_;
  fVar4 = auVar51._0_4_ - auVar47._0_4_;
  auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar61),auVar52);
  auVar48 = vpternlogd_avx512vl(auVar55,auVar47,auVar54,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = ZEXT416((uint)fVar61);
  if (iVar42 < (int)auVar47._0_4_) {
    auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar48,auVar51);
    auVar56._8_4_ = 0x3effffff;
    auVar56._0_8_ = 0x3effffff3effffff;
    auVar56._12_4_ = 0x3effffff;
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar49 = vpternlogd_avx512vl(auVar57,auVar47,auVar56,0xea);
    auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
    auVar47 = vroundss_avx(auVar47,auVar47,0xb);
    if (iVar42 < (int)auVar47._0_4_) {
      auVar47 = vfmadd231ss_fma(auVar52,auVar48,ZEXT416(0x41300000));
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar49 = vpternlogd_avx512vl(auVar58,auVar47,auVar56,0xea);
      auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
      auVar47 = vroundss_avx(auVar47,auVar47,0xb);
      if ((int)auVar47._0_4_ + iVar42 <= iimage->width) {
        auVar47 = vfmadd231ss_fma(auVar51,auVar48,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar49 = vpternlogd_avx512vl(auVar56,auVar47,auVar15,0xf8);
        auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
        auVar47 = vroundss_avx(auVar47,auVar47,0xb);
        if ((int)auVar47._0_4_ + iVar42 <= iimage->height) {
          pfVar38 = iimage->data;
          iVar1 = iimage->data_width;
          iVar45 = iVar42 * 2;
          pfVar33 = haarResponseY + 0x19;
          pfVar46 = haarResponseX + 0x19;
          uVar19 = 0xfffffff4;
          do {
            auVar47._0_4_ = (float)(int)uVar19;
            auVar76 = in_ZMM8._4_12_;
            auVar47._4_12_ = auVar76;
            auVar47 = vfmadd213ss_fma(auVar47,auVar48,ZEXT416((uint)(fVar4 + 0.5)));
            iVar22 = (int)auVar47._0_4_;
            auVar71._0_4_ = (float)(int)(uVar19 | 1);
            auVar71._4_12_ = auVar76;
            auVar47 = vfmadd213ss_fma(auVar71,auVar48,ZEXT416((uint)(fVar4 + 0.5)));
            iVar28 = (int)auVar47._0_4_;
            iVar30 = (iVar22 + -1) * iVar1;
            iVar17 = (iVar22 + -1 + iVar42) * iVar1;
            iVar31 = (iVar22 + -1 + iVar45) * iVar1;
            iVar18 = (iVar28 + -1) * iVar1;
            iVar22 = (iVar28 + -1 + iVar42) * iVar1;
            iVar28 = (iVar28 + -1 + iVar45) * iVar1;
            lVar26 = 0;
            do {
              iVar32 = (int)lVar26 + -0xc;
              auVar72._0_4_ = (float)iVar32;
              auVar72._4_12_ = auVar76;
              auVar47 = vfmadd213ss_fma(auVar72,auVar48,ZEXT416((uint)(fVar3 + 0.5)));
              iVar23 = (int)auVar47._0_4_;
              auVar73._0_4_ = (float)((int)lVar26 + -0xb);
              auVar73._4_12_ = auVar55._4_12_;
              auVar47 = vfmadd213ss_fma(auVar73,auVar48,ZEXT416((uint)(fVar3 + 0.5)));
              iVar37 = (int)auVar47._0_4_;
              iVar41 = iVar23 + -1 + iVar42;
              iVar34 = iVar23 + -1 + iVar45;
              fVar61 = pfVar38[iVar17 + -1 + iVar23];
              fVar66 = pfVar38[iVar31 + -1 + iVar23];
              fVar5 = pfVar38[iVar31 + iVar34];
              fVar6 = pfVar38[iVar30 + -1 + iVar23];
              fVar7 = pfVar38[iVar30 + iVar34];
              auVar49 = SUB6416(ZEXT464(0x40000000),0);
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar30 + iVar41] -
                                                      pfVar38[iVar31 + iVar41])),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              fVar67 = pfVar38[iVar17 + iVar34];
              pfVar46[lVar26 + -0x19] = (fVar66 - fVar7) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              pfVar33[lVar26 + -0x19] = auVar47._0_4_ - (fVar66 - fVar7);
              fVar61 = pfVar38[iVar22 + -1 + iVar23];
              fVar66 = pfVar38[iVar28 + -1 + iVar23];
              fVar5 = pfVar38[iVar34 + iVar28];
              fVar6 = pfVar38[iVar18 + -1 + iVar23];
              fVar7 = pfVar38[iVar18 + iVar34];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar18 + iVar41] -
                                                      pfVar38[iVar41 + iVar28])),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              fVar67 = pfVar38[iVar22 + iVar34];
              pfVar46[lVar26 + -1] = (fVar66 - fVar7) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              pfVar33[lVar26 + -1] = auVar47._0_4_ - (fVar66 - fVar7);
              iVar23 = iVar37 + -1 + iVar42;
              iVar34 = iVar37 + -1 + iVar45;
              fVar61 = pfVar38[iVar17 + -1 + iVar37];
              fVar66 = pfVar38[iVar31 + -1 + iVar37];
              fVar5 = pfVar38[iVar31 + iVar34];
              fVar6 = pfVar38[iVar30 + -1 + iVar37];
              fVar7 = pfVar38[iVar30 + iVar34];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar30 + iVar23] -
                                                      pfVar38[iVar31 + iVar23])),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              fVar67 = pfVar38[iVar17 + iVar34];
              pfVar46[lVar26 + -0x18] = (fVar66 - fVar7) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              pfVar33[lVar26 + -0x18] = auVar47._0_4_ - (fVar66 - fVar7);
              fVar61 = pfVar38[iVar22 + -1 + iVar37];
              fVar66 = pfVar38[iVar28 + -1 + iVar37];
              fVar5 = pfVar38[iVar34 + iVar28];
              fVar6 = pfVar38[iVar18 + -1 + iVar37];
              fVar7 = pfVar38[iVar18 + iVar34];
              fVar67 = pfVar38[iVar22 + iVar34];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar18 + iVar23] -
                                                      pfVar38[iVar23 + iVar28])),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              pfVar46[lVar26] = (fVar66 - fVar7) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),auVar49,
                                        ZEXT416((uint)(fVar5 - fVar6)));
              pfVar33[lVar26] = auVar47._0_4_ - (fVar66 - fVar7);
              lVar26 = lVar26 + 2;
            } while (iVar32 < 10);
            pfVar33 = pfVar33 + 0x30;
            pfVar46 = pfVar46 + 0x30;
            bVar2 = (int)uVar19 < 10;
            uVar19 = uVar19 + 2;
          } while (bVar2);
          goto LAB_001b97ea;
        }
      }
    }
  }
  iVar1 = iVar42 * 2;
  lVar26 = 0;
  uVar19 = 0xfffffff4;
  do {
    auVar62._0_4_ = (float)(int)uVar19;
    auVar62._4_12_ = in_ZMM8._4_12_;
    auVar47 = vfmadd213ss_fma(auVar62,auVar79._0_16_,ZEXT416((uint)fVar4));
    auVar64._0_4_ = (float)(int)(uVar19 | 1);
    auVar64._4_12_ = in_ZMM8._4_12_;
    auVar49 = vfmadd213ss_fma(auVar64,auVar79._0_16_,ZEXT416((uint)fVar4));
    fVar61 = auVar47._0_4_;
    iVar17 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    fVar61 = auVar49._0_4_;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    iVar30 = iVar17 + -1 + iVar42;
    iVar31 = iVar22 + -1 + iVar42;
    lVar25 = lVar26;
    iVar45 = -0xc;
    do {
      auVar63._0_4_ = (float)iVar45;
      auVar63._4_12_ = in_ZMM8._4_12_;
      auVar47 = vfmadd213ss_fma(auVar63,auVar79._0_16_,ZEXT416((uint)fVar3));
      auVar68._0_4_ = (float)(iVar45 + 1);
      auVar68._4_12_ = in_ZMM8._4_12_;
      auVar49 = vfmadd213ss_fma(auVar68,auVar79._0_16_,ZEXT416((uint)fVar3));
      fVar61 = auVar47._0_4_;
      fVar66 = auVar49._0_4_;
      pfVar38 = (float *)((long)haarResponseY + lVar25);
      iVar28 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
      if ((((iVar17 < 1) || (iVar28 < 1)) || (iimage->height < iVar1 + iVar17)) ||
         (iVar18 = iVar1 + iVar28, iimage->width < iVar18)) {
        haarXY(iimage,iVar17,iVar28,iVar42,(float *)((long)haarResponseX + lVar25),pfVar38);
      }
      else {
        iVar34 = iVar28 + -1 + iVar42;
        pfVar46 = iimage->data;
        iVar32 = iimage->data_width;
        iVar23 = iVar32 * (iVar17 + -1);
        iVar41 = iVar32 * iVar30;
        fVar61 = pfVar46[iVar41 + -1 + iVar28];
        iVar32 = iVar32 * (iVar1 + -1 + iVar17);
        fVar5 = pfVar46[iVar32 + -1 + iVar28];
        fVar6 = pfVar46[iVar32 + -1 + iVar18];
        fVar7 = pfVar46[iVar23 + -1 + iVar28];
        fVar67 = pfVar46[iVar23 + -1 + iVar18];
        fVar8 = pfVar46[iVar41 + -1 + iVar18];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar46[iVar23 + iVar34] - pfVar46[iVar32 + iVar34]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *(float *)((long)haarResponseX + lVar25) = (fVar5 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar38 = auVar47._0_4_ - (fVar5 - fVar67);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar25 + 0x60);
      pfVar46 = (float *)((long)haarResponseY + lVar25 + 0x60);
      if (((iVar22 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar1 + iVar22 || (iVar18 = iVar1 + iVar28, iimage->width < iVar18)))) {
        haarXY(iimage,iVar22,iVar28,iVar42,pfVar38,pfVar46);
      }
      else {
        iVar23 = iVar28 + -1 + iVar42;
        pfVar33 = iimage->data;
        iVar32 = iimage->data_width;
        iVar34 = iVar32 * (iVar22 + -1);
        iVar41 = iVar32 * iVar31;
        fVar61 = pfVar33[iVar41 + -1 + iVar28];
        iVar32 = iVar32 * (iVar1 + -1 + iVar22);
        fVar5 = pfVar33[iVar32 + -1 + iVar28];
        fVar6 = pfVar33[iVar32 + -1 + iVar18];
        fVar7 = pfVar33[iVar34 + -1 + iVar28];
        fVar67 = pfVar33[iVar34 + -1 + iVar18];
        fVar8 = pfVar33[iVar41 + -1 + iVar18];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar33[iVar34 + iVar23] - pfVar33[iVar32 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar38 = (fVar5 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar46 = auVar47._0_4_ - (fVar5 - fVar67);
      }
      iVar28 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      pfVar38 = (float *)((long)haarResponseX + lVar25 + 4);
      pfVar46 = (float *)((long)haarResponseY + lVar25 + 4);
      if (((iVar17 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar1 + iVar17 || (iVar18 = iVar1 + iVar28, iimage->width < iVar18)))) {
        haarXY(iimage,iVar17,iVar28,iVar42,pfVar38,pfVar46);
      }
      else {
        iVar34 = iVar28 + -1 + iVar42;
        pfVar33 = iimage->data;
        iVar32 = iimage->data_width;
        iVar23 = iVar32 * (iVar17 + -1);
        iVar41 = iVar32 * iVar30;
        fVar61 = pfVar33[iVar41 + -1 + iVar28];
        iVar32 = iVar32 * (iVar1 + -1 + iVar17);
        fVar66 = pfVar33[iVar32 + -1 + iVar28];
        fVar5 = pfVar33[iVar32 + -1 + iVar18];
        fVar6 = pfVar33[iVar23 + -1 + iVar28];
        fVar7 = pfVar33[iVar23 + -1 + iVar18];
        fVar67 = pfVar33[iVar41 + -1 + iVar18];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar33[iVar23 + iVar34] - pfVar33[iVar32 + iVar34]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar66 - fVar7) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar46 = auVar47._0_4_ - (fVar66 - fVar7);
      }
      pfVar38 = (float *)((long)haarResponseX + lVar25 + 100);
      pfVar46 = (float *)((long)haarResponseY + lVar25 + 100);
      if ((((iVar22 < 1) || (iVar28 < 1)) || (iimage->height < iVar1 + iVar22)) ||
         (iVar18 = iVar1 + iVar28, iimage->width < iVar18)) {
        haarXY(iimage,iVar22,iVar28,iVar42,pfVar38,pfVar46);
      }
      else {
        iVar23 = iVar28 + -1 + iVar42;
        pfVar33 = iimage->data;
        iVar32 = iimage->data_width;
        iVar34 = iVar32 * (iVar22 + -1);
        iVar41 = iVar32 * iVar31;
        fVar61 = pfVar33[iVar41 + -1 + iVar28];
        iVar32 = iVar32 * (iVar1 + -1 + iVar22);
        fVar66 = pfVar33[iVar32 + -1 + iVar28];
        fVar5 = pfVar33[iVar32 + -1 + iVar18];
        fVar6 = pfVar33[iVar34 + -1 + iVar28];
        fVar7 = pfVar33[iVar34 + -1 + iVar18];
        fVar67 = pfVar33[iVar41 + -1 + iVar18];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar33[iVar34 + iVar23] - pfVar33[iVar32 + iVar23]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar38 = (fVar66 - fVar7) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar67)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar46 = auVar47._0_4_ - (fVar66 - fVar7);
      }
      auVar79 = ZEXT1664(auVar48);
      lVar25 = lVar25 + 8;
      bVar2 = iVar45 < 10;
      iVar45 = iVar45 + 2;
    } while (bVar2);
    lVar26 = lVar26 + 0xc0;
    bVar2 = (int)uVar19 < 10;
    uVar19 = uVar19 + 2;
  } while (bVar2);
LAB_001b97ea:
  fVar61 = auVar79._0_4_;
  auVar78._8_4_ = 0x3effffff;
  auVar78._0_8_ = 0x3effffff3effffff;
  auVar78._12_4_ = 0x3effffff;
  auVar77._8_4_ = 0x80000000;
  auVar77._0_8_ = 0x8000000080000000;
  auVar77._12_4_ = 0x80000000;
  auVar47 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 0.5)),auVar77,0xf8);
  auVar47 = ZEXT416((uint)(fVar61 * 0.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 1.5)),auVar77,0xf8);
  auVar48 = ZEXT416((uint)(fVar61 * 1.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 2.5)),auVar77,0xf8);
  auVar49 = ZEXT416((uint)(fVar61 * 2.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 3.5)),auVar77,0xf8);
  auVar50 = ZEXT416((uint)(fVar61 * 3.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 4.5)),auVar77,0xf8);
  auVar51 = ZEXT416((uint)(fVar61 * 4.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 5.5)),auVar77,0xf8);
  auVar52 = ZEXT416((uint)(fVar61 * 5.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 6.5)),auVar77,0xf8);
  auVar53 = ZEXT416((uint)(fVar61 * 6.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 7.5)),auVar77,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + fVar61 * 7.5));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 8.5)),auVar77,0xf8);
  auVar55 = ZEXT416((uint)(fVar61 * 8.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 9.5)),auVar77,0xf8);
  auVar56 = ZEXT416((uint)(fVar61 * 9.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 10.5)),auVar77,0xf8);
  auVar57 = ZEXT416((uint)(fVar61 * 10.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar78,ZEXT416((uint)(fVar61 * 11.5)),auVar77,0xf8);
  auVar58 = ZEXT416((uint)(fVar61 * 11.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  fVar67 = auVar49._0_4_;
  fVar61 = fVar67 + auVar48._0_4_;
  fVar3 = fVar67 + auVar47._0_4_;
  fVar4 = fVar67 - auVar47._0_4_;
  fVar66 = fVar67 - auVar48._0_4_;
  fVar5 = fVar67 - auVar50._0_4_;
  fVar6 = fVar67 - auVar51._0_4_;
  fVar7 = fVar67 - auVar52._0_4_;
  fVar67 = fVar67 - auVar53._0_4_;
  fVar75 = auVar54._0_4_;
  fVar8 = fVar75 - auVar50._0_4_;
  fVar9 = fVar75 - auVar51._0_4_;
  fVar10 = fVar75 - auVar52._0_4_;
  fVar11 = fVar75 - auVar53._0_4_;
  fVar12 = fVar75 - auVar55._0_4_;
  fVar13 = fVar75 - auVar56._0_4_;
  fVar14 = fVar75 - auVar57._0_4_;
  fVar75 = fVar75 - auVar58._0_4_;
  gauss_s1_c0[0] = expf(fVar61 * fVar61 * fVar60);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar60);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar60);
  gauss_s1_c0[3] = expf(fVar66 * fVar66 * fVar60);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar5 * fVar5 * fVar60);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar60);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar60);
  gauss_s1_c0[8] = expf(fVar67 * fVar67 * fVar60);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar60);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar60);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar60);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar60);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar60);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar60);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar60);
  gauss_s1_c1[8] = expf(fVar75 * fVar75 * fVar60);
  uVar20 = 0xfffffff8;
  lVar26 = 0;
  fVar61 = 0.0;
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  lVar25 = 0;
  lVar39 = 0;
  do {
    pfVar38 = gauss_s1_c1;
    uVar19 = (uint)uVar20;
    if (uVar19 != 7) {
      pfVar38 = gauss_s1_c0;
    }
    if (uVar19 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    lVar25 = (long)(int)lVar25;
    iVar42 = (int)lVar39;
    lVar39 = (long)iVar42;
    lVar36 = (long)haarResponseX + lVar26;
    lVar27 = (long)haarResponseY + lVar26;
    uVar35 = 0xfffffff8;
    uVar29 = 0;
    do {
      pfVar46 = gauss_s1_c1;
      if (uVar35 != 7) {
        pfVar46 = gauss_s1_c0;
      }
      if (uVar35 == 0xfffffff8) {
        pfVar46 = gauss_s1_c1;
      }
      uVar21 = (ulong)(uVar35 >> 0x1c & 0xfffffff8);
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar24 = uVar29;
      lVar43 = lVar36;
      lVar44 = lVar27;
      do {
        lVar40 = 0;
        pfVar33 = (float *)((long)pfVar38 + (ulong)(uint)((int)(uVar20 >> 0x1f) << 5));
        do {
          fVar3 = pfVar46[uVar21] * *pfVar33;
          auVar47 = vinsertps_avx(ZEXT416(*(uint *)(lVar44 + lVar40 * 4)),
                                  ZEXT416(*(uint *)(lVar43 + lVar40 * 4)),0x10);
          auVar74._0_4_ = fVar3 * auVar47._0_4_;
          auVar74._4_4_ = fVar3 * auVar47._4_4_;
          auVar74._8_4_ = fVar3 * auVar47._8_4_;
          auVar74._12_4_ = fVar3 * auVar47._12_4_;
          auVar47 = vandps_avx(auVar74,auVar65);
          auVar47 = vmovlhps_avx(auVar74,auVar47);
          auVar69._0_4_ = auVar79._0_4_ + auVar47._0_4_;
          auVar69._4_4_ = auVar79._4_4_ + auVar47._4_4_;
          auVar69._8_4_ = auVar79._8_4_ + auVar47._8_4_;
          auVar69._12_4_ = auVar79._12_4_ + auVar47._12_4_;
          auVar79 = ZEXT1664(auVar69);
          pfVar33 = pfVar33 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          lVar40 = lVar40 + 1;
        } while (lVar40 != 9);
        uVar24 = uVar24 + 0x18;
        uVar21 = uVar21 + (ulong)(-1 < (int)uVar35) * 2 + -1;
        lVar43 = lVar43 + 0x60;
        lVar44 = lVar44 + 0x60;
      } while (uVar24 < uVar35 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar39];
      auVar16._4_4_ = fVar3;
      auVar16._0_4_ = fVar3;
      auVar16._8_4_ = fVar3;
      auVar16._12_4_ = fVar3;
      auVar49 = vmulps_avx512vl(auVar69,auVar16);
      lVar39 = lVar39 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar25) = auVar49;
      auVar70._0_4_ = auVar49._0_4_ * auVar49._0_4_;
      auVar70._4_4_ = auVar49._4_4_ * auVar49._4_4_;
      auVar70._8_4_ = auVar49._8_4_ * auVar49._8_4_;
      auVar70._12_4_ = auVar49._12_4_ * auVar49._12_4_;
      auVar47 = vmovshdup_avx(auVar70);
      auVar48 = vfmadd231ss_fma(auVar47,auVar49,auVar49);
      auVar47 = vshufpd_avx(auVar49,auVar49,1);
      auVar48 = vfmadd213ss_fma(auVar47,auVar47,auVar48);
      auVar47 = vshufps_avx(auVar49,auVar49,0xff);
      auVar47 = vfmadd213ss_fma(auVar47,auVar47,auVar48);
      fVar61 = fVar61 + auVar47._0_4_;
      lVar25 = lVar25 + 4;
      uVar35 = uVar35 + 5;
      uVar29 = uVar29 + 0x78;
      lVar36 = lVar36 + 0x1e0;
      lVar27 = lVar27 + 0x1e0;
    } while (iVar42 + 4 != (int)lVar39);
    lVar26 = lVar26 + 0x14;
    uVar20 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar61 < 0.0) {
    fVar61 = sqrtf(fVar61);
  }
  else {
    auVar47 = vsqrtss_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
    fVar61 = auVar47._0_4_;
  }
  auVar79 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar61)));
  lVar26 = 0;
  do {
    auVar59 = vmulps_avx512f(auVar79,*(undefined1 (*) [64])(ipoint->descriptor + lVar26));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar26) = auVar59;
    lVar26 = lVar26 + 0x10;
  } while (lVar26 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_2_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}